

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udp.c
# Opt level: O0

void udp_ep_stop(void *arg)

{
  nni_time nVar1;
  nni_time nVar2;
  bool bVar3;
  nni_time linger;
  udp_ep *ep;
  void *arg_local;
  
  nni_aio_stop((nni_aio *)((long)arg + 0x220));
  nni_aio_stop((nni_aio *)((long)arg + 0x658));
  nni_aio_stop((nni_aio *)((long)arg + 0x58));
  nVar1 = nni_clock();
  nni_mtx_lock((nni_mtx *)((long)arg + 8));
  *(undefined1 *)((long)arg + 0x34) = 1;
  while( true ) {
    bVar3 = false;
    if (*(short *)((long)arg + 0xa44) != 0) {
      nVar2 = nni_clock();
      bVar3 = nVar2 < nVar1 + 500;
    }
    if (!bVar3) break;
    nni_mtx_unlock((nni_mtx *)((long)arg + 8));
    nng_msleep(1);
    nni_mtx_lock((nni_mtx *)((long)arg + 8));
  }
  if (*(short *)((long)arg + 0xa44) != 0) {
    nng_log_warn("NNG-UDP-LINGER",
                 "Lingering timed out on endpoint close, peer notifications dropped");
  }
  nni_mtx_unlock((nni_mtx *)((long)arg + 8));
  nni_aio_stop((nni_aio *)((long)arg + 0x490));
  return;
}

Assistant:

static void
udp_ep_stop(void *arg)
{
	udp_ep *ep = arg;

	nni_aio_stop(&ep->resaio);
	nni_aio_stop(&ep->rx_aio);
	nni_aio_stop(&ep->timeaio);

	// We optionally linger a little bit (up to a half second)
	// so that the disconnect messages can get pushed out.  On
	// most systems this should only take a single millisecond.
	nni_time linger =
	    nni_clock() + NNI_SECOND / 2; // half second to drain, max
	nni_mtx_lock(&ep->mtx);
	ep->fini = true;
	while ((ep->tx_ring.count > 0) && (nni_clock() < linger)) {
		nni_mtx_unlock(&ep->mtx);
		nng_msleep(1);
		nni_mtx_lock(&ep->mtx);
	}
	if (ep->tx_ring.count > 0) {
		nng_log_warn("NNG-UDP-LINGER",
		    "Lingering timed out on endpoint close, peer "
		    "notifications dropped");
	}
	nni_mtx_unlock(&ep->mtx);

	// finally close the tx channel
	nni_aio_stop(&ep->tx_aio);
}